

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O3

void __thiscall vmbt_isaac_ifc::seed_str(vmbt_isaac_ifc *this,char *str,size_t len)

{
  if (0x3ff < len) {
    len = 0x400;
  }
  memset(this->ctx->rsl,0,0x400);
  memcpy(this->ctx->rsl,str,len);
  isaac_init(this->ctx,1);
  return;
}

Assistant:

virtual void seed_str(const char *str, size_t len)
    {
        /* 
         *   Copy the string value into the rsl array; copy as much as will
         *   fit, and zero the rest.  (The point here is to be deterministic,
         *   so we want this to be the same every time with a given seed - we
         *   don't want to include random data left behind from previous
         *   iterations.)
         */
        if (len > sizeof(ctx->rsl))
            len = sizeof(ctx->rsl);

        memset(ctx->rsl, 0, sizeof(ctx->rsl));
        memcpy(ctx->rsl, str, len);

        /* initialize with the rsl data */
        isaac_init(ctx, TRUE);
    }